

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

void ch_addnative(ch_context *context,ch_native_function function,char *name)

{
  _Bool _Var1;
  size_t size;
  ch_string *key;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar2;
  ch_primitive value;
  
  size = strlen(name);
  key = ch_loadstring(context,name,size,true);
  aVar2.object_value = &ch_loadnative(function)->object;
  value.field_1.object_value = aVar2.object_value;
  value._0_8_ = 3;
  _Var1 = ch_table_set(&context->globals,key,value);
  if (_Var1) {
    return;
  }
  ch_runtime_error(context,EXIT_GLOBAL_ALREADY_EXISTS,
                   "Global variable has already been defined: %s.",key->value);
  return;
}

Assistant:

void ch_addnative(ch_context *context, ch_native_function function,
                  const char *name) {
  ch_string *s = ch_loadstring(context, name, strlen(name), true);
  ch_native *native = ch_loadnative(function);

  add_global(context, s, MAKE_OBJECT(native));
}